

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python.cc
# Opt level: O3

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
flatbuffers::python::Keywords_abi_cxx11_
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,python *this,Version *version)

{
  _Rb_tree_header *p_Var1;
  short sVar2;
  long *plVar3;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator_type local_482;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_481;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  undefined1 *local_460 [2];
  undefined1 local_450 [16];
  undefined1 *local_440 [2];
  undefined1 local_430 [16];
  undefined1 *local_420 [2];
  undefined1 local_410 [16];
  undefined1 *local_400 [2];
  undefined1 local_3f0 [16];
  undefined1 *local_3e0 [2];
  undefined1 local_3d0 [16];
  undefined1 *local_3c0 [2];
  undefined1 local_3b0 [16];
  undefined1 *local_3a0 [2];
  undefined1 local_390 [16];
  undefined1 *local_380 [2];
  undefined1 local_370 [16];
  undefined1 *local_360 [2];
  undefined1 local_350 [16];
  undefined1 *local_340 [2];
  undefined1 local_330 [16];
  undefined1 *local_320 [2];
  undefined1 local_310 [16];
  undefined1 *local_300 [2];
  undefined1 local_2f0 [16];
  undefined1 *local_2e0 [2];
  undefined1 local_2d0 [16];
  undefined1 *local_2c0 [2];
  undefined1 local_2b0 [16];
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  undefined1 *local_280 [2];
  undefined1 local_270 [16];
  undefined1 *local_260 [2];
  undefined1 local_250 [16];
  undefined1 *local_240 [2];
  undefined1 local_230 [16];
  undefined1 *local_220 [2];
  undefined1 local_210 [16];
  undefined1 *local_200 [2];
  undefined1 local_1f0 [16];
  undefined1 *local_1e0 [2];
  undefined1 local_1d0 [16];
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  undefined1 *local_180 [2];
  undefined1 local_170 [16];
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  long *local_c0 [2];
  long local_b0 [2];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  long *local_40 [2];
  long local_30 [2];
  
  sVar2 = *(short *)this;
  if ((sVar2 == 0) || (sVar2 == 3)) {
    local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"and","");
    local_460[0] = local_450;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"as","");
    local_440[0] = local_430;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"assert","");
    local_420[0] = local_410;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"async","");
    local_400[0] = local_3f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"await","");
    local_3e0[0] = local_3d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"break","");
    local_3c0[0] = local_3b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"class","");
    local_3a0[0] = local_390;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"continue","");
    local_380[0] = local_370;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"def","");
    local_360[0] = local_350;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"del","");
    local_340[0] = local_330;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"elif","");
    local_320[0] = local_310;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"else","");
    local_300[0] = local_2f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"except","");
    local_2e0[0] = local_2d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"False","");
    local_2c0[0] = local_2b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"finally","");
    local_2a0[0] = local_290;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"for","");
    local_280[0] = local_270;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"from","");
    local_260[0] = local_250;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"global","");
    local_240[0] = local_230;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"if","");
    local_220[0] = local_210;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"import","");
    local_200[0] = local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"in","");
    local_1e0[0] = local_1d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"is","");
    local_1c0[0] = local_1b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"lambda","");
    local_1a0[0] = local_190;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"None","");
    local_180[0] = local_170;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"nonlocal","");
    local_160[0] = local_150;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"not","");
    local_140[0] = local_130;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"or","");
    local_120[0] = local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"pass","");
    local_100[0] = local_f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"raise","");
    local_e0[0] = local_d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"return","");
    local_c0[0] = local_b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"True","");
    local_a0[0] = local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"try","");
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"while","");
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"with","");
    plVar3 = local_30;
    local_40[0] = plVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"yield","");
    __l_00._M_len = 0x23;
    __l_00._M_array = &local_480;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(__return_storage_ptr__,__l_00,&local_481,&local_482);
    lVar4 = -0x460;
    do {
      if (plVar3 != (long *)plVar3[-2]) {
        operator_delete((long *)plVar3[-2],*plVar3 + 1);
      }
      plVar3 = plVar3 + -4;
      lVar4 = lVar4 + 0x20;
    } while (lVar4 != 0);
  }
  else if (sVar2 == 2) {
    local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"and","");
    local_460[0] = local_450;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"as","");
    local_440[0] = local_430;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"assert","");
    local_420[0] = local_410;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"break","");
    local_400[0] = local_3f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"class","");
    local_3e0[0] = local_3d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"continue","");
    local_3c0[0] = local_3b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"def","");
    local_3a0[0] = local_390;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"del","");
    local_380[0] = local_370;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"elif","");
    local_360[0] = local_350;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"else","");
    local_340[0] = local_330;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"except","");
    local_320[0] = local_310;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"exec","");
    local_300[0] = local_2f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"finally","");
    local_2e0[0] = local_2d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"for","");
    local_2c0[0] = local_2b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"from","");
    local_2a0[0] = local_290;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"global","");
    local_280[0] = local_270;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"if","");
    local_260[0] = local_250;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"import","");
    local_240[0] = local_230;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"in","");
    local_220[0] = local_210;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"is","");
    local_200[0] = local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"lambda","");
    local_1e0[0] = local_1d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"not","");
    local_1c0[0] = local_1b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"or","");
    local_1a0[0] = local_190;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"pass","");
    local_180[0] = local_170;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"print","");
    local_160[0] = local_150;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"raise","");
    local_140[0] = local_130;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"return","");
    local_120[0] = local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"try","");
    local_100[0] = local_f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"while","");
    local_e0[0] = local_d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"with","");
    plVar3 = local_b0;
    local_c0[0] = plVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"yield","");
    __l._M_len = 0x1f;
    __l._M_array = &local_480;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(__return_storage_ptr__,__l,&local_481,&local_482);
    lVar4 = -0x3e0;
    do {
      if (plVar3 != (long *)plVar3[-2]) {
        operator_delete((long *)plVar3[-2],*plVar3 + 1);
      }
      plVar3 = plVar3 + -4;
      lVar4 = lVar4 + 0x20;
    } while (lVar4 != 0);
  }
  else {
    p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
    *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
    *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<std::string> Keywords(const Version &version) {
  switch (version.major) {
    case 2:
      // https://docs.python.org/2/reference/lexical_analysis.html#keywords
      return {
          "and",   "as",     "assert", "break",  "class", "continue", "def",
          "del",   "elif",   "else",   "except", "exec",  "finally",  "for",
          "from",  "global", "if",     "import", "in",    "is",       "lambda",
          "not",   "or",     "pass",   "print",  "raise", "return",   "try",
          "while", "with",   "yield",
      };
    case 0:
    case 3:
      // https://docs.python.org/3/reference/lexical_analysis.html#keywords
      return {
          "and",      "as",       "assert",  "async", "await",  "break",
          "class",    "continue", "def",     "del",   "elif",   "else",
          "except",   "False",    "finally", "for",   "from",   "global",
          "if",       "import",   "in",      "is",    "lambda", "None",
          "nonlocal", "not",      "or",      "pass",  "raise",  "return",
          "True",     "try",      "while",   "with",  "yield",
      };
    default:
      return {};
  }
}